

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall ThreadContext::CompactStoreFieldInlineCaches(ThreadContext *this)

{
  int iVar1;
  Type pSVar2;
  ulong uVar3;
  int iVar4;
  
  if ((this->storeFieldInlineCacheByPropId).bucketCount != 0) {
    uVar3 = 0;
    do {
      iVar4 = (this->storeFieldInlineCacheByPropId).buckets[uVar3];
      if (iVar4 != -1) {
        while (iVar4 != -1) {
          pSVar2 = (this->storeFieldInlineCacheByPropId).entries;
          iVar1 = pSVar2[iVar4].
                  super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .
                  super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                  .
                  super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                  .
                  super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                  .next;
          CompactInlineCacheList
                    (this,pSVar2[iVar4].
                          super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                          .
                          super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                          .
                          super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                          .
                          super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                          .value);
          iVar4 = iVar1;
          if (this->unregisteredInlineCacheCount == 0) {
            return;
          }
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (this->storeFieldInlineCacheByPropId).bucketCount);
  }
  return;
}

Assistant:

bool MapEntryUntil(Fn fn) const
        {
            for (uint i = 0; i < bucketCount; i++)
            {
                if(buckets[i] != -1)
                {
                    int nextIndex = -1;
                    for (int currentIndex = buckets[i] ; currentIndex != -1 ; currentIndex = nextIndex)
                    {
                        nextIndex = entries[currentIndex].next;
                        if (fn(entries[currentIndex]))
                        {
                            return true; // fn condition succeeds
                        }
                    }
                }
            }

            return false;
        }